

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O1

int main(void)

{
  treeNode *tree;
  string path;
  ifstream file;
  undefined1 *local_238;
  undefined8 local_230;
  undefined1 local_228 [16];
  istream local_218 [520];
  
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"Please input the script path:",0x1d);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '\x10');
  std::ostream::put('\x10');
  std::ostream::flush();
  local_230 = 0;
  local_228[0] = 0;
  local_238 = local_228;
  std::operator>>((istream *)&std::cin,(string *)&local_238);
  std::ifstream::ifstream(local_218,(string *)&local_238,_S_in);
  tree = parse(local_218);
  Executor::execute(tree);
  std::ifstream::close();
  std::ifstream::~ifstream(local_218);
  if (local_238 != local_228) {
    operator_delete(local_238);
  }
  return 0;
}

Assistant:

int main()
{
    cout<<"Please input the script path:"<<endl;
    string path;
    cin>>path;
    ifstream file(path);
    treeNode* tree=parse(file);
    Executor::execute(tree);
    file.close();
}